

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O2

DdNode * Llb_ManCreateConstraints(Llb_Man_t *p,Vec_Int_t *vHints,int fUseNsVars)

{
  DdManager *pDVar1;
  abctime aVar2;
  Vec_Int_t *p_00;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  DdNode *pDVar7;
  void *pvVar8;
  Aig_Man_t *pAVar9;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar10;
  void *pvVar11;
  DdNode *n;
  DdNode *n_00;
  int iVar12;
  
  pDVar1 = p->dd;
  if (vHints == (Vec_Int_t *)0x0) {
    pDVar7 = Cudd_ReadOne(pDVar1);
    return pDVar7;
  }
  aVar2 = pDVar1->TimeStop;
  pDVar1->TimeStop = 0;
  if (p->pAig->nObjs[2] != p->pAigGlo->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p->pAig) == Aig_ManCiNum(p->pAigGlo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Reach.c"
                  ,0x1a5,"DdNode *Llb_ManCreateConstraints(Llb_Man_t *, Vec_Int_t *, int)");
  }
  Aig_ManCleanData(p->pAig);
  pDVar7 = Cudd_ReadOne(p->dd);
  (p->pAig->pConst1->field_5).pData = pDVar7;
  for (iVar12 = 0; pAVar9 = p->pAig, iVar12 < pAVar9->nTruePis; iVar12 = iVar12 + 1) {
    pvVar8 = Vec_PtrEntry(pAVar9->vCis,iVar12);
    pDVar1 = p->dd;
    iVar4 = Vec_IntEntry(p->vObj2Var,*(int *)((long)pvVar8 + 0x24));
    pDVar7 = Cudd_bddIthVar(pDVar1,iVar4);
    *(DdNode **)((long)pvVar8 + 0x28) = pDVar7;
  }
  iVar12 = 0;
  do {
    if (pAVar9->nRegs <= iVar12) {
      Aig_ManCleanData(p->pAigGlo);
      pDVar7 = Cudd_ReadOne(p->dd);
      (p->pAigGlo->pConst1->field_5).pData = pDVar7;
      for (iVar12 = 0; pVVar3 = p->pAigGlo->vCis, iVar12 < pVVar3->nSize; iVar12 = iVar12 + 1) {
        pvVar8 = Vec_PtrEntry(pVVar3,iVar12);
        pvVar11 = Vec_PtrEntry(p->pAig->vCis,iVar12);
        *(undefined8 *)((long)pvVar8 + 0x28) = *(undefined8 *)((long)pvVar11 + 0x28);
      }
      pDVar7 = Cudd_ReadOne(p->dd);
      Cudd_Ref(pDVar7);
      for (iVar12 = 0; iVar12 < vHints->nSize; iVar12 = iVar12 + 1) {
        uVar6 = Vec_IntEntry(vHints,iVar12);
        n_00 = pDVar7;
        if (uVar6 < 2) {
          pAVar9 = p->pAigGlo;
          pVVar3 = pAVar9->vObjs;
          if (pVVar3 == (Vec_Ptr_t *)0x0) {
            pAVar10 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(pVVar3,iVar12);
          }
          n = Llb_ManConstructOutBdd(pAVar9,pAVar10,p->dd);
          Cudd_Ref(n);
          n_00 = Cudd_bddAnd(p->dd,pDVar7,(DdNode *)((ulong)uVar6 ^ (ulong)n));
          Cudd_Ref(n_00);
          Cudd_RecursiveDeref(p->dd,pDVar7);
          Cudd_RecursiveDeref(p->dd,(DdNode *)((ulong)uVar6 ^ (ulong)n));
        }
        pDVar7 = n_00;
      }
      Cudd_Deref(pDVar7);
      p->dd->TimeStop = aVar2;
      return pDVar7;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAVar9->vCis,pAVar9->nTruePis + iVar12);
    p_00 = p->vObj2Var;
    pAVar10 = pObj;
    if (fUseNsVars != 0) {
      if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
LAB_0068636a:
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      pAVar9 = p->pAig;
      iVar4 = Aig_ObjCioId(pObj);
      if (iVar4 < pAVar9->nTruePis) goto LAB_0068636a;
      pVVar3 = pAVar9->vCos;
      iVar4 = pAVar9->nTruePos;
      iVar5 = Aig_ObjCioId(pObj);
      pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(pVVar3,(iVar4 + iVar5) - pAVar9->nTruePis);
    }
    iVar4 = Vec_IntEntry(p_00,pAVar10->Id);
    pDVar7 = Cudd_bddIthVar(p->dd,iVar4);
    (pObj->field_5).pData = pDVar7;
    iVar12 = iVar12 + 1;
    pAVar9 = p->pAig;
  } while( true );
}

Assistant:

DdNode * Llb_ManCreateConstraints( Llb_Man_t * p, Vec_Int_t * vHints, int fUseNsVars )
{
    DdNode * bConstr, * bFunc, * bTemp;
    Aig_Obj_t * pObj;
    int i, Entry;
    abctime TimeStop;
    if ( vHints == NULL )
        return Cudd_ReadOne( p->dd );
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    assert( Aig_ManCiNum(p->pAig) == Aig_ManCiNum(p->pAigGlo) );
    // assign const and PI nodes to the original AIG
    Aig_ManCleanData( p->pAig );
    Aig_ManConst1( p->pAig )->pData = Cudd_ReadOne( p->dd );
    Saig_ManForEachPi( p->pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var,Aig_ObjId(pObj)) );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        if ( fUseNsVars )
            Entry = Vec_IntEntry( p->vObj2Var, Aig_ObjId(Saig_ObjLoToLi(p->pAig, pObj)) );
        else
            Entry = Vec_IntEntry( p->vObj2Var, Aig_ObjId(pObj) );
        pObj->pData = Cudd_bddIthVar( p->dd, Entry );
    }
    // transfer them to the global AIG
    Aig_ManCleanData( p->pAigGlo );
    Aig_ManConst1( p->pAigGlo )->pData = Cudd_ReadOne( p->dd );
    Aig_ManForEachCi( p->pAigGlo, pObj, i )
        pObj->pData = Aig_ManCi(p->pAig, i)->pData;
    // derive consraints
    bConstr = Cudd_ReadOne( p->dd );   Cudd_Ref( bConstr );
    Vec_IntForEachEntry( vHints, Entry, i )
    {
        if ( Entry != 0 && Entry != 1 )
            continue;
        bFunc = Llb_ManConstructOutBdd( p->pAigGlo, Aig_ManObj(p->pAigGlo, i), p->dd );  Cudd_Ref( bFunc );
        bFunc = Cudd_NotCond( bFunc, Entry ); // restrict to not constraint
        // make the product
        bConstr = Cudd_bddAnd( p->dd, bTemp = bConstr, bFunc );                          Cudd_Ref( bConstr );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bFunc );
    }
    Cudd_Deref( bConstr );
    p->dd->TimeStop = TimeStop;
    return bConstr;
}